

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O2

double mp::ComputeValue<mp::VarInfoRecomp>(ImplicationConstraint *con,VarInfoRecomp *x)

{
  VarVecRecomp *this;
  double dVar1;
  double dVar2;
  double dVar3;
  
  this = &(x->super_VarInfoRecompTypedef).x_;
  dVar1 = VarVecRecomp::operator[]
                    (this,(con->
                          super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>
                          ).args_._M_elems[0]);
  dVar2 = VarVecRecomp::operator[]
                    (this,(con->
                          super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>
                          ).args_._M_elems[1]);
  dVar3 = VarVecRecomp::operator[]
                    (this,(con->
                          super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>
                          ).args_._M_elems[2]);
  dVar3 = (double)(0.5 <= dVar3 && dVar1 < 0.5);
  return (double)((-(ulong)(0.5 <= dVar2) & 0x3ff0000000000000 |
                  ~-(ulong)(0.5 <= dVar2) & (ulong)dVar3) & -(ulong)(0.5 <= dVar1) |
                 ~-(ulong)(0.5 <= dVar1) & (ulong)dVar3);
}

Assistant:

double ComputeValue(const ImplicationConstraint& con, const VarVec& x) {
  auto i = x[con.GetArguments()[0]];
  auto c1 = x[con.GetArguments()[1]];
  auto c2 = x[con.GetArguments()[2]];
  return (i>=0.5 && c1>=0.5) || (i<0.5 && c2>=0.5);
}